

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

int Fraig_HashTableLookupS
              (Fraig_Man_t *pMan,Fraig_Node_t *p1,Fraig_Node_t *p2,Fraig_Node_t **ppNodeRes)

{
  uint uVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t **ppFVar3;
  Fraig_Node_t *pFVar4;
  uint uVar5;
  Fraig_Node_t *pFVar6;
  Fraig_Node_t **ppFVar7;
  ulong uVar8;
  Fraig_Node_t *pFVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  timespec ts;
  timespec local_40;
  
  pFVar9 = p1;
  if (*(int *)((ulong)p2 & 0xfffffffffffffffe) < *(int *)((ulong)p1 & 0xfffffffffffffffe)) {
    pFVar9 = p2;
    p2 = p1;
  }
  pFVar2 = pMan->pTableS;
  uVar13 = (long)p2 * 0xc00005 + (long)pFVar9;
  iVar10 = pFVar2->nBins;
  uVar15 = uVar13 % (ulong)(long)iVar10 & 0xffffffff;
  for (pFVar6 = pFVar2->pBins[uVar15]; pFVar6 != (Fraig_Node_t *)0x0; pFVar6 = pFVar6->pNextS) {
    if ((pFVar6->p1 == pFVar9) && (pFVar6->p2 == p2)) {
      *ppNodeRes = pFVar6;
      return 1;
    }
  }
  if (SBORROW4(pFVar2->nEntries,iVar10 * 2) == pFVar2->nEntries + iVar10 * -2 < 0) {
    clock_gettime(3,&local_40);
    uVar1 = pFVar2->nBins;
    uVar11 = uVar1 * 2 - 1;
    while( true ) {
      do {
        uVar12 = uVar11 + 1;
        uVar5 = uVar11 & 1;
        uVar11 = uVar12;
      } while (uVar5 != 0);
      if (uVar12 < 9) break;
      iVar10 = 5;
      while (uVar12 % (iVar10 - 2U) != 0) {
        uVar5 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar12 < uVar5) goto LAB_005f32f2;
      }
    }
LAB_005f32f2:
    uVar15 = (ulong)(int)uVar12;
    ppFVar7 = (Fraig_Node_t **)calloc(1,uVar15 * 8);
    if ((int)uVar1 < 1) {
      iVar10 = 0;
    }
    else {
      ppFVar3 = pFVar2->pBins;
      uVar14 = 0;
      iVar10 = 0;
      do {
        pFVar6 = ppFVar3[uVar14];
        while (pFVar6 != (Fraig_Node_t *)0x0) {
          pFVar4 = pFVar6->pNextS;
          uVar8 = (ulong)((long)pFVar6->p2 * 0xc00005 + (long)pFVar6->p1) % uVar15 & 0xffffffff;
          pFVar6->pNextS = ppFVar7[uVar8];
          ppFVar7[uVar8] = pFVar6;
          iVar10 = iVar10 + 1;
          pFVar6 = pFVar4;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar1);
    }
    if (iVar10 != pFVar2->nEntries) {
      __assert_fail("Counter == p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                    ,0x11b,"void Fraig_TableResizeS(Fraig_HashTable_t *)");
    }
    if (pFVar2->pBins != (Fraig_Node_t **)0x0) {
      free(pFVar2->pBins);
    }
    pFVar2->pBins = ppFVar7;
    pFVar2->nBins = uVar12;
    uVar15 = uVar13 % uVar15 & 0xffffffff;
  }
  pFVar9 = Fraig_NodeCreate(pMan,pFVar9,p2);
  ppFVar7 = pFVar2->pBins;
  pFVar9->pNextS = ppFVar7[uVar15];
  ppFVar7[uVar15] = pFVar9;
  *ppNodeRes = pFVar9;
  pFVar2->nEntries = pFVar2->nEntries + 1;
  return 0;
}

Assistant:

int Fraig_HashTableLookupS( Fraig_Man_t * pMan, Fraig_Node_t * p1, Fraig_Node_t * p2, Fraig_Node_t ** ppNodeRes )
{
    Fraig_HashTable_t * p = pMan->pTableS;
    Fraig_Node_t * pEnt;
    unsigned Key;

    // order the arguments
    if ( Fraig_Regular(p1)->Num > Fraig_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Fraig_HashKey2( p1, p2, p->nBins );
    Fraig_TableBinForEachEntryS( p->pBins[Key], pEnt )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
        {
            *ppNodeRes = pEnt;
            return 1;
        }
    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeS( p );
        Key = Fraig_HashKey2( p1, p2, p->nBins );
    }
    // create the new node
    pEnt = Fraig_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNextS = p->pBins[Key];
    p->pBins[Key] = pEnt;
    *ppNodeRes = pEnt;
    p->nEntries++;
    return 0;
}